

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmTarget * __thiscall
cmMakefile::AddImportedTarget(cmMakefile *this,string *name,TargetType type,bool global)

{
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> uVar1;
  __uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> this_00;
  __uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> *p_Var2;
  undefined7 in_register_00000009;
  unique_ptr<cmTarget,_std::default_delete<cmTarget>_> target;
  tuple<cmTarget_*,_std::default_delete<cmTarget>_> local_30;
  
  this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (tuple<cmTarget_*,_std::default_delete<cmTarget>_>)operator_new(8);
  cmTarget::cmTarget((cmTarget *)
                     this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>
                     .super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl,name,type,
                     (int)CONCAT71(in_register_00000009,global) + VisibilityImported,this);
  target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
  super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true>)
       (__uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true>)
       this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
       super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  p_Var2 = (__uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_> *)
           std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->ImportedTargets,name);
  p_Var2->_M_t = this_00._M_t.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                 super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  cmGlobalGenerator::IndexTarget
            (this->GlobalGenerator,
             (cmTarget *)
             target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
             super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
             super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl);
  local_30.super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>)
       (_Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>)
       target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
       super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
       super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
  std::vector<cmTarget*,std::allocator<cmTarget*>>::emplace_back<cmTarget*>
            ((vector<cmTarget*,std::allocator<cmTarget*>> *)&this->ImportedTargetsOwned,
             (cmTarget **)&local_30);
  uVar1 = target;
  target._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
  super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
  super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true>)
       (__uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>)0x0;
  std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>::~unique_ptr(&target);
  return (cmTarget *)
         (__uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>)
         uVar1._M_t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
         super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
         super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl;
}

Assistant:

cmTarget* cmMakefile::AddImportedTarget(const std::string& name,
                                        cmStateEnums::TargetType type,
                                        bool global)
{
  // Create the target.
  std::unique_ptr<cmTarget> target(
    new cmTarget(name, type,
                 global ? cmTarget::VisibilityImportedGlobally
                        : cmTarget::VisibilityImported,
                 this));

  // Add to the set of available imported targets.
  this->ImportedTargets[name] = target.get();
  this->GetGlobalGenerator()->IndexTarget(target.get());

  // Transfer ownership to this cmMakefile object.
  this->ImportedTargetsOwned.push_back(target.get());
  return target.release();
}